

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

spv_result_t spvtools::anon_unknown_6::getWord(spv_text text,spv_position position,string *word)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char ch;
  bool escaping;
  bool quoting;
  size_t start_index;
  string *word_local;
  spv_position position_local;
  spv_text text_local;
  
  if ((text->str == (char *)0x0) || (text->length == 0)) {
    text_local._4_4_ = SPV_ERROR_INVALID_TEXT;
  }
  else if (position == (spv_position)0x0) {
    text_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    sVar2 = position->index;
    bVar4 = false;
    bVar3 = false;
    while (position->index < text->length) {
      cVar1 = text->str[position->index];
      if (cVar1 == '\\') {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else {
        iVar5 = (int)cVar1;
        if (cVar1 == '\0') {
          std::__cxx11::string::assign<char_const*,void>
                    ((string *)word,text->str + sVar2,text->str + position->index);
          return SPV_SUCCESS;
        }
        if (((iVar5 - 9U < 2) || (iVar5 == 0xd)) || (iVar5 == 0x20)) {
LAB_0020c192:
          if ((!bVar3) && (!bVar4)) {
            std::__cxx11::string::assign<char_const*,void>
                      ((string *)word,text->str + sVar2,text->str + position->index);
            return SPV_SUCCESS;
          }
        }
        else if (iVar5 == 0x22) {
          if (!bVar3) {
            bVar4 = (bool)(bVar4 ^ 1);
          }
        }
        else if (iVar5 == 0x3b) goto LAB_0020c192;
        bVar3 = false;
      }
      position->column = position->column + 1;
      position->index = position->index + 1;
    }
    std::__cxx11::string::assign<char_const*,void>
              ((string *)word,text->str + sVar2,text->str + position->index);
    text_local._4_4_ = SPV_SUCCESS;
  }
  return text_local._4_4_;
}

Assistant:

spv_result_t getWord(spv_text text, spv_position position, std::string* word) {
  if (!text->str || !text->length) return SPV_ERROR_INVALID_TEXT;
  if (!position) return SPV_ERROR_INVALID_POINTER;

  const size_t start_index = position->index;

  bool quoting = false;
  bool escaping = false;

  // NOTE: Assumes first character is not white space!
  while (true) {
    if (position->index >= text->length) {
      word->assign(text->str + start_index, text->str + position->index);
      return SPV_SUCCESS;
    }
    const char ch = text->str[position->index];
    if (ch == '\\') {
      escaping = !escaping;
    } else {
      switch (ch) {
        case '"':
          if (!escaping) quoting = !quoting;
          break;
        case ' ':
        case ';':
        case '\t':
        case '\n':
        case '\r':
          if (escaping || quoting) break;
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        case '\0': {  // NOTE: End of word found!
          word->assign(text->str + start_index, text->str + position->index);
          return SPV_SUCCESS;
        }
        default:
          break;
      }
      escaping = false;
    }

    position->column++;
    position->index++;
  }
}